

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O0

void open_func(LexState *ls,FuncState *fs)

{
  lua_State *L_00;
  StkId pTVar1;
  GCObject *pGVar2;
  Table *pTVar3;
  TValue *i_o_1;
  TValue *i_o;
  Proto *f;
  lua_State *L;
  FuncState *fs_local;
  LexState *ls_local;
  
  L_00 = ls->L;
  pGVar2 = (GCObject *)luaF_newproto(L_00);
  fs->f = (Proto *)pGVar2;
  fs->prev = ls->fs;
  fs->ls = ls;
  fs->L = L_00;
  ls->fs = fs;
  fs->pc = 0;
  fs->lasttarget = -1;
  fs->jpc = -1;
  fs->freereg = 0;
  fs->nk = 0;
  fs->np = 0;
  fs->nlocvars = 0;
  fs->nactvar = '\0';
  fs->bl = (BlockCnt *)0x0;
  (pGVar2->p).source = ls->source;
  (pGVar2->p).maxstacksize = '\x02';
  pTVar3 = luaH_new(L_00,0,0);
  fs->h = pTVar3;
  pTVar1 = L_00->top;
  pTVar1->value = (Value)fs->h;
  pTVar1->tt = 5;
  if ((long)L_00->stack_last - (long)L_00->top < 0x11) {
    luaD_growstack(L_00,1);
  }
  L_00->top = L_00->top + 1;
  pTVar1 = L_00->top;
  (pTVar1->value).gc = pGVar2;
  pTVar1->tt = 9;
  if ((long)L_00->stack_last - (long)L_00->top < 0x11) {
    luaD_growstack(L_00,1);
  }
  L_00->top = L_00->top + 1;
  return;
}

Assistant:

static void open_func (LexState *ls, FuncState *fs) {
  lua_State *L = ls->L;
  Proto *f = luaF_newproto(L);
  fs->f = f;
  fs->prev = ls->fs;  /* linked list of funcstates */
  fs->ls = ls;
  fs->L = L;
  ls->fs = fs;
  fs->pc = 0;
  fs->lasttarget = -1;
  fs->jpc = NO_JUMP;
  fs->freereg = 0;
  fs->nk = 0;
  fs->np = 0;
  fs->nlocvars = 0;
  fs->nactvar = 0;
  fs->bl = NULL;
  f->source = ls->source;
  f->maxstacksize = 2;  /* registers 0/1 are always valid */
  fs->h = luaH_new(L, 0, 0);
  /* anchor table of constants and prototype (to avoid being collected) */
  sethvalue2s(L, L->top, fs->h);
  incr_top(L);
  setptvalue2s(L, L->top, f);
  incr_top(L);
}